

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cpp
# Opt level: O0

void indk::Profiler::doEmit(NeuralNet *object,int flag)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
  it;
  pair<std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>,_std::_Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
  callback;
  NeuralNet *pNStack_10;
  int flag_local;
  NeuralNet *object_local;
  
  callback.second._M_node._4_4_ = flag;
  pNStack_10 = object;
  _it = std::
        multimap<indk::NeuralNet_*,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>,_std::less<indk::NeuralNet_*>,_std::allocator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>_>
        ::equal_range(&Callbacks,&stack0xfffffffffffffff0);
  local_30._M_node = it._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_30,&callback.first);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
             ::operator->(&local_30);
    if ((ppVar2->second).second == callback.second._M_node._4_4_) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
               ::operator->(&local_30);
      std::function<void_(indk::NeuralNet_*)>::operator()(&(ppVar2->second).first,pNStack_10);
    }
    std::
    _Rb_tree_iterator<std::pair<indk::NeuralNet_*const,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_>_>
    ::operator++(&local_30,0);
  }
  return;
}

Assistant:

void indk::Profiler::doEmit(indk::NeuralNet *object, int flag) {
    auto callback = Callbacks.equal_range(object);
    for (auto it = callback.first; it != callback.second; it++) {
        if (it->second.second == flag) it->second.first(object);
    }
}